

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::Storage::setApplicationArguments(Storage *this,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  EnumType EVar3;
  Configurations *configurations;
  RegisteredLoggers *configurations_00;
  RegisteredLoggers *pRVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__nptr;
  Storage *in_RDI;
  int userInput;
  iterator it;
  Configurations c;
  CommandLineArgs *in_stack_ffffffffffffff08;
  ConfigurationType configurationType;
  Configurations *in_stack_ffffffffffffff10;
  Logger *this_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>,_true>
  local_a8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>,_true>
  local_a0;
  char *in_stack_ffffffffffffff78;
  CommandLineArgs *in_stack_ffffffffffffff80;
  
  utils::CommandLineArgs::setArgs
            ((CommandLineArgs *)
             c.super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
             super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
             ._16_8_,c.super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
                     super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                     .super_ThreadSafe._12_4_,
             (char **)c.super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
                      super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                      .super_ThreadSafe._vptr_ThreadSafe);
  this_00 = (Logger *)in_RDI->m_vRegistry;
  commandLineArgs(in_RDI);
  VRegistry::setFromArgs((VRegistry *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  configurationType = (ConfigurationType)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  bVar1 = utils::CommandLineArgs::hasParamWithValue
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (bVar1) {
    Configurations::Configurations(in_stack_ffffffffffffff10);
    configurations =
         (Configurations *)
         utils::CommandLineArgs::getParamValue(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    pRVar4 = (RegisteredLoggers *)&stack0xffffffffffffff6b;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff78,(char *)configurations,(allocator *)pRVar4);
    Configurations::setGlobally(in_stack_ffffffffffffff10,configurationType,(string *)0x231886);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6b);
    configurations_00 = registeredLoggers(in_RDI);
    RegisteredLoggers::setDefaultConfigurations(pRVar4,(Configurations *)configurations_00);
    pRVar4 = registeredLoggers(in_RDI);
    iVar2 = (*(pRVar4->
              super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).
              super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
              .super_ThreadSafe._vptr_ThreadSafe[5])();
    local_a0._M_cur = (__node_type *)CONCAT44(extraout_var,iVar2);
    while( true ) {
      pRVar4 = registeredLoggers(in_RDI);
      iVar2 = (*(pRVar4->
                super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).
                super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
                .super_ThreadSafe._vptr_ThreadSafe[6])();
      local_a8._M_cur = (__node_type *)CONCAT44(extraout_var_00,iVar2);
      bVar1 = utils::std::__detail::operator!=(&local_a0,&local_a8);
      if (!bVar1) break;
      utils::std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>,_false,_true>
                    *)0x23193e);
      Logger::configure(this_00,configurations);
      utils::std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>,_false,_true>
                    *)pRVar4);
    }
    Configurations::~Configurations((Configurations *)pRVar4);
  }
  bVar1 = utils::CommandLineArgs::hasParamWithValue
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (bVar1) {
    __nptr = utils::CommandLineArgs::getParamValue
                       (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    EVar3 = atoi(__nptr);
    in_RDI->m_flags = EVar3;
  }
  return;
}

Assistant:

void Storage::setApplicationArguments(int argc, char** argv) {
  m_commandLineArgs.setArgs(argc, argv);
  m_vRegistry->setFromArgs(commandLineArgs());
  // default log file
#if !defined(ELPP_DISABLE_LOG_FILE_FROM_ARG)
  if (m_commandLineArgs.hasParamWithValue(base::consts::kDefaultLogFileParam)) {
    Configurations c;
    c.setGlobally(ConfigurationType::Filename,
                  std::string(m_commandLineArgs.getParamValue(base::consts::kDefaultLogFileParam)));
    registeredLoggers()->setDefaultConfigurations(c);
    for (base::RegisteredLoggers::iterator it = registeredLoggers()->begin();
         it != registeredLoggers()->end(); ++it) {
      it->second->configure(c);
    }
  }
#endif  // !defined(ELPP_DISABLE_LOG_FILE_FROM_ARG)
#if defined(ELPP_LOGGING_FLAGS_FROM_ARG)
  if (m_commandLineArgs.hasParamWithValue(base::consts::kLoggingFlagsParam)) {
    int userInput = atoi(m_commandLineArgs.getParamValue(base::consts::kLoggingFlagsParam));
    if (ELPP_DEFAULT_LOGGING_FLAGS == 0x0) {
      m_flags = userInput;
    } else {
      base::utils::addFlag<base::type::EnumType>(userInput, &m_flags);
    }
  }
#endif  // defined(ELPP_LOGGING_FLAGS_FROM_ARG)
}